

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::LocalClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,LocalClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  uint *puVar1;
  ClientHook *pCVar2;
  LocalRequest *pLVar3;
  Own<capnp::LocalRequest,_std::nullptr_t> hook;
  Builder root;
  uint16_t local_64;
  CallHints local_62;
  Own<capnp::LocalRequest,_std::nullptr_t> local_60;
  Builder local_50;
  uint64_t local_38;
  char local_30 [8];
  uint64_t local_28;
  undefined8 uStack_20;
  Own<capnp::RequestHook,_std::nullptr_t> local_18;
  
  pCVar2 = (this->resolved).ptr.ptr;
  local_64 = methodId;
  local_62 = hints;
  local_38 = interfaceId;
  if (pCVar2 == (ClientHook *)0x0) {
    puVar1 = &(this->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_50.builder.segment = (SegmentBuilder *)&this->super_Refcounted;
    local_50.builder.capTable = (CapTableBuilder *)this;
    kj::
    heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,capnp::Capability::Client::CallHints&,kj::Own<capnp::LocalClient,decltype(nullptr)>>
              ((kj *)&local_60,&local_38,&local_64,sizeHint,&local_62,
               (Own<capnp::LocalClient,_std::nullptr_t> *)&local_50);
    kj::Own<capnp::LocalClient,_std::nullptr_t>::dispose
              ((Own<capnp::LocalClient,_std::nullptr_t> *)&local_50);
    MessageBuilder::getRootInternal
              (&local_50,&(((local_60.ptr)->message).ptr)->super_MessageBuilder);
    pLVar3 = local_60.ptr;
    (__return_storage_ptr__->super_Builder).builder.pointer = local_50.builder.pointer;
    (__return_storage_ptr__->super_Builder).builder.segment = local_50.builder.segment;
    (__return_storage_ptr__->super_Builder).builder.capTable = local_50.builder.capTable;
    local_18.disposer = local_60.disposer;
    local_60.ptr = (LocalRequest *)0x0;
    (__return_storage_ptr__->hook).disposer = local_60.disposer;
    (__return_storage_ptr__->hook).ptr = &pLVar3->super_RequestHook;
    local_18.ptr = (RequestHook *)0x0;
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_18);
    kj::Own<capnp::LocalRequest,_std::nullptr_t>::dispose(&local_60);
  }
  else {
    local_30[0] = (sizeHint->ptr).isSet;
    if ((bool)local_30[0] == true) {
      local_28 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_20 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar2->_vptr_ClientHook)(__return_storage_ptr__,pCVar2,interfaceId,(ulong)methodId,local_30)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      // We resolved to a shortened path. New calls MUST go directly to the replacement capability
      // so that their ordering is consistent with callers who call getResolved() to get direct
      // access to the new capability. In particular it's important that we don't place these calls
      // in our streaming queue.
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, hints, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }